

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Valuator.H
# Opt level: O0

void __thiscall Fl_Valuator::~Fl_Valuator(Fl_Valuator *this)

{
  code *pcVar1;
  Fl_Valuator *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

class FL_EXPORT Fl_Valuator : public Fl_Widget {

  double value_;
  double previous_value_;
  double min, max; // truncates to this range *after* rounding
  double A; int B; // rounds to multiples of A/B, or no rounding if A is zero

protected:
  /** Tells if the valuator is an FL_HORIZONTAL one */
  int horizontal() const {return type()& FL_HORIZONTAL;}